

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O3

void __thiscall
fizplex::LPTest_AddObjValue_Test::~LPTest_AddObjValue_Test(LPTest_AddObjValue_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(LPTest, AddObjValue) {
  LP lp;
  lp.add_column(ColType::Bounded, 0, 5);
  lp.add_row(RowType::Range, 3, 15);
  const double d = 3.14;
  lp.add_logicals();
  lp.add_obj_value(0, d);
  EXPECT_DOUBLE_EQ(d, lp.get_obj_value(0));
}